

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int add_base128_integer(CBB *cbb,uint64_t v)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = 0;
  for (uVar3 = v; uVar3 != 0; uVar3 = uVar3 >> 7) {
    iVar4 = iVar4 + 1;
  }
  uVar5 = iVar4 + (uint)(iVar4 == 0);
  iVar4 = uVar5 * 7;
  uVar1 = uVar5;
  do {
    uVar1 = uVar1 - 1;
    iVar4 = iVar4 + -7;
    if (uVar5 <= uVar1) break;
    iVar2 = CBB_add_u8(cbb,(uVar1 != 0) << 7 | (byte)(v >> ((byte)iVar4 & 0x3f)) & 0x7f);
  } while (iVar2 != 0);
  return (int)(uVar5 <= uVar1);
}

Assistant:

static int add_base128_integer(CBB *cbb, uint64_t v) {
  unsigned len_len = 0;
  uint64_t copy = v;
  while (copy > 0) {
    len_len++;
    copy >>= 7;
  }
  if (len_len == 0) {
    len_len = 1;  // Zero is encoded with one byte.
  }
  for (unsigned i = len_len - 1; i < len_len; i--) {
    uint8_t byte = (v >> (7 * i)) & 0x7f;
    if (i != 0) {
      // The high bit denotes whether there is more data.
      byte |= 0x80;
    }
    if (!CBB_add_u8(cbb, byte)) {
      return 0;
    }
  }
  return 1;
}